

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdUpdateTxInSequence
              (void *handle,void *create_handle,char *txid,uint32_t vout,uint32_t sequence)

{
  Transaction *this;
  ConfidentialTransaction *this_00;
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  uint32_t in_R8D;
  CfdException *except;
  exception *std_except;
  uint32_t index_1;
  ConfidentialTransactionContext *tx_1;
  uint32_t index;
  TransactionContext *tx;
  bool is_bitcoin;
  Txid txid_obj;
  CfdCapiTransactionData *tx_data;
  int result;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe70;
  CfdException *this_01;
  allocator *is_bitcoin_00;
  int in_stack_fffffffffffffeb4;
  undefined1 local_119 [40];
  allocator local_f1;
  string local_f0;
  Txid local_d0;
  undefined1 local_aa;
  allocator local_a9;
  string *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  uint32_t local_28;
  uint local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  is_bitcoin_00 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TransactionData",is_bitcoin_00);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x321;
    local_88.funcname = "CfdUpdateTxInSequence";
    cfd::core::logger::warn<>(&local_88,"txid is null or empty.");
    local_aa = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,"Failed to parameter. txid is null or empty.",
               &local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    local_aa = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,local_20,&local_f1);
  cfd::core::Txid::Txid(&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_119[0x27] = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffeb4,(bool *)is_bitcoin_00);
  if (*(long *)(local_70 + 0x18) == 0) {
    uVar3 = __cxa_allocate_exception(0x30);
    this_01 = (CfdException *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_119 + 1),"Invalid handle state. tx is null",(allocator *)this_01);
    cfd::core::CfdException::CfdException
              (this_01,(CfdError)((ulong)uVar3 >> 0x20),
               (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_119[0x27] & 1) == 0) {
    this_00 = *(ConfidentialTransaction **)(local_70 + 0x18);
    uVar2 = (*(this_00->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this_00,&local_d0,(ulong)local_24);
    cfd::core::ConfidentialTransaction::SetTxInSequence(this_00,uVar2,local_28);
  }
  else {
    this = *(Transaction **)(local_70 + 0x18);
    uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this,&local_d0,(ulong)local_24);
    cfd::core::Transaction::SetTxInSequence(this,uVar2,local_28);
  }
  local_4 = 0;
  cfd::core::Txid::~Txid((Txid *)0x60c16e);
  return local_4;
}

Assistant:

int CfdUpdateTxInSequence(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    uint32_t sequence) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetTxInSequence(index, sequence);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->SetTxInSequence(index, sequence);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}